

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void WriteHeader(ostream *os,char *Name)

{
  char cVar1;
  size_t sVar2;
  long *plVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"//",2);
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"// Source: ",0xb);
  if (Name == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(Name);
    std::__ostream_insert<char,std::char_traits<char>>(os,Name,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"// Translated from Basic to C++ using btran",0x2b);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"//",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

static void WriteHeader(
	std::ostream& os,		/**< Output stream */
	const char* Name		/**< File name */
)
{
#ifdef HAVE_STRFTIME
	char Text[64];
	time_t timer;
	struct tm *tblock;

	timer = time((time_t*)NULL);
	tblock = localtime(&timer);

	strftime(Text, sizeof(Text), "%A, %B %d, %Y at %X",
		tblock);
#endif

	os << "//" << std::endl;
	os << "// Source: " << Name << std::endl;
	os << "// Translated from Basic to C++ using btran" << std::endl;
#ifdef HAVE_STRFTIME
	os << "// on " << Text << std::endl;
#endif
	os << "//" << std::endl << std::endl;
}